

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_string
                   (Curl_easy *data,connectdata *conn,char *conn_to_host,char **host_result,
                   int *port_result)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_79;
  long port_to_match;
  char *endp;
  char *ptr_next;
  char *hostname_to_match;
  size_t hostname_to_match_len;
  int port_match;
  int host_match;
  char *ptr;
  int *piStack_38;
  CURLcode result;
  int *port_result_local;
  char **host_result_local;
  char *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ptr._4_4_ = CURLE_OK;
  hostname_to_match_len._4_4_ = 0;
  hostname_to_match_len._0_4_ = 0;
  *host_result = (char *)0x0;
  *port_result = -1;
  piStack_38 = port_result;
  port_result_local = (int *)host_result;
  host_result_local = (char **)conn_to_host;
  conn_to_host_local = (char *)conn;
  conn_local = (connectdata *)data;
  if (*conn_to_host == ':') {
    hostname_to_match_len._4_4_ = 1;
    _port_match = conn_to_host + 1;
  }
  else {
    pcVar3 = "";
    if (((uint)conn->bits >> 0xb & 1) != 0) {
      pcVar3 = "[";
    }
    pcVar2 = "";
    if (((uint)conn->bits >> 0xb & 1) != 0) {
      pcVar2 = "]";
    }
    _port_match = conn_to_host;
    ptr_next = curl_maprintf("%s%s%s",pcVar3,(conn->host).name,pcVar2);
    if (ptr_next == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    hostname_to_match = (char *)strlen(ptr_next);
    hostname_to_match_len._4_4_ = curl_strnequal(_port_match,ptr_next,(size_t)hostname_to_match);
    (*Curl_cfree)(ptr_next);
    local_79 = false;
    if (hostname_to_match_len._4_4_ != 0) {
      local_79 = hostname_to_match[(long)_port_match] == ':';
    }
    hostname_to_match_len._4_4_ = (uint)local_79;
    _port_match = hostname_to_match + (long)_port_match + 1;
  }
  if (hostname_to_match_len._4_4_ != 0) {
    if (*_port_match == ':') {
      hostname_to_match_len._0_4_ = 1;
      _port_match = _port_match + 1;
    }
    else {
      endp = strchr(_port_match,0x3a);
      if (endp != (char *)0x0) {
        port_to_match = 0;
        lVar1 = strtol(_port_match,(char **)&port_to_match,10);
        if (((char *)port_to_match == endp) && (lVar1 == *(int *)(conn_to_host_local + 0x46c))) {
          hostname_to_match_len._0_4_ = 1;
          _port_match = endp + 1;
        }
      }
    }
  }
  if ((hostname_to_match_len._4_4_ != 0) && ((int)hostname_to_match_len != 0)) {
    ptr._4_4_ = parse_connect_to_host_port
                          ((Curl_easy *)conn_local,_port_match,(char **)port_result_local,piStack_38
                          );
  }
  return ptr._4_4_;
}

Assistant:

static CURLcode parse_connect_to_string(struct Curl_easy *data,
                                        struct connectdata *conn,
                                        const char *conn_to_host,
                                        char **host_result,
                                        int *port_result)
{
  CURLcode result = CURLE_OK;
  const char *ptr = conn_to_host;
  int host_match = FALSE;
  int port_match = FALSE;

  *host_result = NULL;
  *port_result = -1;

  if(*ptr == ':') {
    /* an empty hostname always matches */
    host_match = TRUE;
    ptr++;
  }
  else {
    /* check whether the URL's hostname matches */
    size_t hostname_to_match_len;
    char *hostname_to_match = aprintf("%s%s%s",
                                      conn->bits.ipv6_ip ? "[" : "",
                                      conn->host.name,
                                      conn->bits.ipv6_ip ? "]" : "");
    if(!hostname_to_match)
      return CURLE_OUT_OF_MEMORY;
    hostname_to_match_len = strlen(hostname_to_match);
    host_match = strncasecompare(ptr, hostname_to_match,
                                 hostname_to_match_len);
    free(hostname_to_match);
    ptr += hostname_to_match_len;

    host_match = host_match && *ptr == ':';
    ptr++;
  }

  if(host_match) {
    if(*ptr == ':') {
      /* an empty port always matches */
      port_match = TRUE;
      ptr++;
    }
    else {
      /* check whether the URL's port matches */
      char *ptr_next = strchr(ptr, ':');
      if(ptr_next) {
        char *endp = NULL;
        long port_to_match = strtol(ptr, &endp, 10);
        if((endp == ptr_next) && (port_to_match == conn->remote_port)) {
          port_match = TRUE;
          ptr = ptr_next + 1;
        }
      }
    }
  }

  if(host_match && port_match) {
    /* parse the hostname and port to connect to */
    result = parse_connect_to_host_port(data, ptr, host_result, port_result);
  }

  return result;
}